

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SplitLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_split(NeuralNetworkLayer *this)

{
  bool bVar1;
  SplitLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_split(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_split(this);
    this_00 = (SplitLayerParams *)operator_new(0x20);
    SplitLayerParams::SplitLayerParams(this_00);
    (this->layer_).split_ = this_00;
  }
  return (SplitLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SplitLayerParams* NeuralNetworkLayer::mutable_split() {
  if (!has_split()) {
    clear_layer();
    set_has_split();
    layer_.split_ = new ::CoreML::Specification::SplitLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.split)
  return layer_.split_;
}